

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

unsigned_long jsonnet::internal::jsonnet_string_parse_unicode(LocationRange *loc,char32_t *c)

{
  byte bVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  StaticError *pSVar4;
  long lVar5;
  uint uVar6;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  lVar5 = 0;
  uVar2 = 0;
  while( true ) {
    if (lVar5 == 4) {
      return uVar2;
    }
    bVar1 = (byte)c[lVar5];
    if (bVar1 == 0) break;
    uVar6 = bVar1 - 0x30;
    if (9 < uVar6) {
      if (bVar1 - 0x61 < 6) {
        uVar6 = bVar1 - 0x57;
      }
      else {
        if (5 < bVar1 - 0x41) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar3 = std::operator<<(local_190,"Malformed unicode escape character, ");
          poVar3 = std::operator<<(poVar3,"should be hex: \'");
          poVar3 = std::operator<<(poVar3,bVar1);
          std::operator<<(poVar3,"\'");
          pSVar4 = (StaticError *)__cxa_allocate_exception(0x60);
          std::__cxx11::stringbuf::str();
          StaticError::StaticError(pSVar4,loc,&local_1c0);
          __cxa_throw(pSVar4,&StaticError::typeinfo,StaticError::~StaticError);
        }
        uVar6 = bVar1 - 0x37;
      }
    }
    uVar2 = uVar2 * 0x10 + (ulong)uVar6;
    lVar5 = lVar5 + 1;
  }
  pSVar4 = (StaticError *)__cxa_allocate_exception(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Truncated unicode escape sequence in string literal.",
             (allocator<char> *)&local_1c0);
  StaticError::StaticError(pSVar4,loc,(string *)&ss);
  __cxa_throw(pSVar4,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

unsigned long jsonnet_string_parse_unicode(const LocationRange &loc, const char32_t *c)
{
    unsigned long codepoint = 0;
    // Expect 4 hex digits.
    for (unsigned i = 0; i < 4; ++i) {
        auto x = (unsigned char)(c[i]);
        unsigned digit;
        if (x == '\0') {
            auto msg = "Truncated unicode escape sequence in string literal.";
            throw StaticError(loc, msg);
        } else if (x >= '0' && x <= '9') {
            digit = x - '0';
        } else if (x >= 'a' && x <= 'f') {
            digit = x - 'a' + 10;
        } else if (x >= 'A' && x <= 'F') {
            digit = x - 'A' + 10;
        } else {
            std::stringstream ss;
            ss << "Malformed unicode escape character, "
               << "should be hex: '" << x << "'";
            throw StaticError(loc, ss.str());
        }
        codepoint *= 16;
        codepoint += digit;
    }
    return codepoint;
}